

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

TPZVec<char> * __thiscall TPZVec<char>::operator=(TPZVec<char> *this,initializer_list<char> *list)

{
  size_type sVar1;
  iterator pcVar2;
  char *pcVar3;
  size_type sVar4;
  
  (*this->_vptr_TPZVec[3])();
  sVar1 = list->_M_len;
  if (sVar1 != 0) {
    pcVar2 = list->_M_array;
    pcVar3 = this->fStore;
    sVar4 = 0;
    do {
      pcVar3[sVar4] = pcVar2[sVar4];
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}